

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O2

void __thiscall QLoggingRegistry::setApiRules(QLoggingRegistry *this,QString *content)

{
  bool bVar1;
  long in_FS_OFFSET;
  QStringView content_00;
  QMessageLogger local_70;
  QLoggingSettingsParser local_50;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._rules.d.size = 0;
  local_50._rules.d.d = (Data *)0x0;
  local_50._rules.d.ptr = (QLoggingRule *)0x0;
  local_50.m_inRulesSection = true;
  local_50._1_7_ = 0xaaaaaaaaaaaaaa;
  content_00.m_data = (content->d).ptr;
  content_00.m_size = (content->d).size;
  QLoggingSettingsParser::setContent(&local_50,content_00);
  bVar1 = qtLoggingDebug();
  if (bVar1) {
    local_70.context.version = 2;
    local_70.context.function._4_4_ = 0;
    local_70.context.line = 0;
    local_70.context.file._0_4_ = 0;
    local_70.context.file._4_4_ = 0;
    local_70.context.function._0_4_ = 0;
    local_70.context.category = "qt.core.logging";
    QMessageLogger::debug
              (&local_70,"Loading logging rules set by QLoggingCategory::setFilterRules ...");
  }
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_30._0_8_ = this;
  QBasicMutex::lock((QBasicMutex *)this);
  local_30[8] = true;
  local_70.context.version = (int)local_50._rules.d.d;
  local_70.context.line = (int)((ulong)local_50._rules.d.d >> 0x20);
  local_70.context.file._0_4_ = SUB84(local_50._rules.d.ptr,0);
  local_70.context.file._4_4_ = (undefined4)((ulong)local_50._rules.d.ptr >> 0x20);
  local_70.context.function._0_4_ = (undefined4)local_50._rules.d.size;
  local_70.context.function._4_4_ = (undefined4)((ulong)local_50._rules.d.size >> 0x20);
  if (local_50._rules.d.d != (Data *)0x0) {
    LOCK();
    ((local_50._rules.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50._rules.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QArrayDataPointer<QLoggingRule>::operator=
            (&this->ruleSets[2].d,(QArrayDataPointer<QLoggingRule> *)&local_70);
  QArrayDataPointer<QLoggingRule>::~QArrayDataPointer((QArrayDataPointer<QLoggingRule> *)&local_70);
  updateRules(this);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_30);
  QArrayDataPointer<QLoggingRule>::~QArrayDataPointer(&local_50._rules.d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLoggingRegistry::setApiRules(const QString &content)
{
    QLoggingSettingsParser parser;
    parser.setImplicitRulesSection(true);
    parser.setContent(content);

    if (qtLoggingDebug())
        debugMsg("Loading logging rules set by QLoggingCategory::setFilterRules ...");

    const QMutexLocker locker(&registryMutex);

    ruleSets[ApiRules] = parser.rules();

    updateRules();
}